

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void libyuv::YuvPixel8_16
               (uint8_t y,uint8_t u,uint8_t v,int *b,int *g,int *r,YuvConstants *yuvconstants)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  uint uVar6;
  undefined7 in_register_00000039;
  
  cVar1 = yuvconstants->kUVToG[0];
  cVar2 = yuvconstants->kUVToG[1];
  cVar3 = yuvconstants->kUVToR[1];
  sVar4 = yuvconstants->kUVBiasG[0];
  sVar5 = yuvconstants->kUVBiasR[0];
  uVar6 = (uint)((int)yuvconstants->kYToRgb[0] * (int)CONCAT71(in_register_00000039,y) * 0x101) >>
          0x10;
  *b = ((int)yuvconstants->kUVBiasB[0] -
       (int)yuvconstants->kUVToB[0] * CONCAT31(in_register_00000031,u)) + uVar6;
  *g = ((int)sVar4 -
       ((int)cVar2 * CONCAT31(in_register_00000011,v) +
       (int)cVar1 * CONCAT31(in_register_00000031,u))) + uVar6;
  *r = ((int)sVar5 - (int)cVar3 * CONCAT31(in_register_00000011,v)) + uVar6;
  return;
}

Assistant:

static __inline void YuvPixel8_16(uint8_t y,
                                  uint8_t u,
                                  uint8_t v,
                                  int* b,
                                  int* g,
                                  int* r,
                                  const struct YuvConstants* yuvconstants) {
#if defined(__aarch64__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = -yuvconstants->kUVToRB[1];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#elif defined(__arm__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[4];
  int vr = -yuvconstants->kUVToRB[4];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#else
  int ub = yuvconstants->kUVToB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = yuvconstants->kUVToR[1];
  int bb = yuvconstants->kUVBiasB[0];
  int bg = yuvconstants->kUVBiasG[0];
  int br = yuvconstants->kUVBiasR[0];
  int yg = yuvconstants->kYToRgb[0];
#endif

  uint32_t y1 = (uint32_t)(y * 0x0101 * yg) >> 16;
  *b = (int)(-(u * ub) + y1 + bb);
  *g = (int)(-(u * ug + v * vg) + y1 + bg);
  *r = (int)(-(v * vr) + y1 + br);
}